

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_match.c
# Opt level: O0

wchar_t cmp_node_wcs(archive_rb_node *n1,archive_rb_node *n2)

{
  archive *in_RSI;
  wchar_t *p2;
  wchar_t *p1;
  match_file *f2;
  match_file *f1;
  wchar_t **in_stack_ffffffffffffffc8;
  archive_mstring *in_stack_ffffffffffffffd0;
  undefined4 local_4;
  
  archive_mstring_get_wcs(in_RSI,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  archive_mstring_get_wcs(in_RSI,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  if (in_stack_ffffffffffffffd0 == (archive_mstring *)0x0) {
    local_4 = L'\x01';
  }
  else if (in_stack_ffffffffffffffc8 == (wchar_t **)0x0) {
    local_4 = L'\xffffffff';
  }
  else {
    local_4 = wcscmp((wchar_t *)in_stack_ffffffffffffffd0,(wchar_t *)in_stack_ffffffffffffffc8);
  }
  return local_4;
}

Assistant:

static int
cmp_node_wcs(const struct archive_rb_node *n1,
    const struct archive_rb_node *n2)
{
	struct match_file *f1 = (struct match_file *)(uintptr_t)n1;
	struct match_file *f2 = (struct match_file *)(uintptr_t)n2;
	const wchar_t *p1, *p2;

	archive_mstring_get_wcs(NULL, &(f1->pathname), &p1);
	archive_mstring_get_wcs(NULL, &(f2->pathname), &p2);
	if (p1 == NULL)
		return (1);
	if (p2 == NULL)
		return (-1);
	return (wcscmp(p1, p2));
}